

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectFieldsEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  bool bVar1;
  const_reference pvVar2;
  HeapThunk *v;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_bool>
  pVar3;
  Value VVar4;
  HeapThunk *th;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *field_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *__range3_1;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_000000d0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_000000d8;
  string *in_stack_000000e0;
  LocationRange *in_stack_000000e8;
  Interpreter *in_stack_000000f0;
  Identifier **field;
  iterator __end3;
  iterator __begin3;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *__range3;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  fields;
  bool include_hidden;
  HeapObject *obj;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *in_stack_fffffffffffffde8;
  anon_union_8_3_4e909c26_for_v in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  Type in_stack_fffffffffffffdfc;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined1 *puVar6;
  Type in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  anon_union_8_3_4e909c26_for_v in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 manifesting;
  HeapObject *in_stack_fffffffffffffe80;
  _Self in_stack_fffffffffffffe88;
  _Self local_170;
  undefined1 *local_168;
  long local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Type local_138;
  undefined4 uStack_134;
  anon_union_8_3_4e909c26_for_v local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  reference local_118;
  _Self local_110;
  _Self local_108;
  undefined1 local_100 [48];
  undefined1 *local_d0;
  undefined1 local_c8 [55];
  byte local_91;
  anon_union_8_3_4e909c26_for_v local_90;
  undefined1 local_81;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  allocator<char> local_39;
  string local_38 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  manifesting = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_80 = 0x12;
  local_7c = 1;
  local_78 = &local_80;
  local_70 = 2;
  puVar6 = &local_81;
  pvVar5 = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x296d77);
  __l._M_len = (size_type)puVar6;
  __l._M_array = (iterator)pvVar5;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffe20,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  validateBuiltinArgs(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                      in_stack_000000d0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffffe00);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x296ddb);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  local_90 = pvVar2->v;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,1);
  local_91 = (pvVar2->v).b & 1;
  std::
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::set((set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         *)0x296e3d);
  objectFields((Interpreter *)in_stack_fffffffffffffe88._M_node,in_stack_fffffffffffffe80,
               (bool)manifesting);
  local_d0 = local_100;
  local_108._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::begin((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)in_stack_fffffffffffffde8);
  local_110._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::end((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = std::operator!=(&local_108,&local_110);
    if (!bVar1) break;
    local_118 = std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator*
                          ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)
                           0x296f70);
    pVar3 = std::
            set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
            ::insert(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_128 = (_Base_ptr)pVar3.first._M_node;
    local_120 = pVar3.second;
    std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator++
              ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)
               in_stack_fffffffffffffdf0.h);
  }
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *)0x296ecc);
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)0x297014);
  VVar4 = makeArray((Interpreter *)in_stack_fffffffffffffdf0.h,
                    (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)in_stack_fffffffffffffde8);
  local_130 = VVar4.v;
  local_138 = VVar4.t;
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_134,local_138);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_130;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~vector(in_stack_fffffffffffffe00);
  local_160 = *(long *)(in_RDI + 0x48) + 0x10;
  local_168 = local_c8;
  local_170._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
       ::begin(in_stack_fffffffffffffde8);
  std::
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = std::operator!=(&local_170,(_Self *)&stack0xfffffffffffffe88);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x2970ea);
    v = (anonymous_namespace)::Interpreter::
        makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                  ((Interpreter *)0x0,(Identifier **)(ulong)in_stack_fffffffffffffe68,(void **)0x0,
                   (int *)in_stack_fffffffffffffe58.h,
                   (void **)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)v,(value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    VVar4 = makeString((Interpreter *)in_stack_fffffffffffffdf0.h,(UString *)v);
    in_stack_fffffffffffffdf0 = VVar4.v;
    in_stack_fffffffffffffdfc = VVar4.t;
    in_stack_fffffffffffffe50 = in_stack_fffffffffffffdfc;
    in_stack_fffffffffffffe58 = in_stack_fffffffffffffdf0;
    HeapThunk::fill((HeapThunk *)in_stack_fffffffffffffdf0.h,(Value *)v);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)in_stack_fffffffffffffdf0.h);
  }
  std::
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
          *)0x2971f1);
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectFieldsEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "objectFieldsEx", args, {Value::OBJECT, Value::BOOLEAN});
        const auto *obj = static_cast<HeapObject *>(args[0].v.h);
        bool include_hidden = args[1].v.b;
        // Stash in a set first to sort them.
        std::set<UString> fields;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            fields.insert(field->name);
        }
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto &field : fields) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeString(field));
        }
        return nullptr;
    }